

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_history.cpp
# Opt level: O0

void __thiscall undo::UndoHistory::deleteState(UndoHistory *this,UndoState *state)

{
  UndoState *state_local;
  UndoHistory *this_local;
  
  if (this->m_delegate != (UndoHistoryDelegate *)0x0) {
    (**(code **)(*(long *)this->m_delegate + 0x10))(this->m_delegate,state);
  }
  if (state != (UndoState *)0x0) {
    UndoState::~UndoState(state);
    operator_delete(state);
  }
  return;
}

Assistant:

void UndoHistory::deleteState(UndoState* state)
{
  if (m_delegate)
    m_delegate->onDeleteUndoState(state);

  delete state;
}